

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.cpp
# Opt level: O2

DGNodeArtificial * __thiscall dg::sdg::DGFormalParameters::createVarArg(DGFormalParameters *this)

{
  long *plVar1;
  DGNodeArtificial *pDVar2;
  
  pDVar2 = DependenceGraph::createArtificial(*(DependenceGraph **)this);
  plVar1 = *(long **)(this + 0x30);
  *(DGNodeArtificial **)(this + 0x30) = pDVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    pDVar2 = *(DGNodeArtificial **)(this + 0x30);
  }
  return pDVar2;
}

Assistant:

DGNodeArtificial &DGFormalParameters::createVarArg() {
    auto &dg = getDG();
    _vararg.reset(&dg.createArtificial());
    return *_vararg;
}